

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O1

uint TrimFlags(uint flags)

{
  uint uVar1;
  uint flags_00;
  long in_FS_OFFSET;
  bool local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = flags & 0xfffff7fe;
  if ((flags & 1) != 0) {
    uVar1 = flags;
  }
  flags_00 = uVar1 & 0xfffff6ff;
  if ((uVar1 >> 0xb & 1) != 0) {
    flags_00 = uVar1;
  }
  local_11 = IsValidFlagCombination(flags_00);
  inline_assertion_check<true,bool>
            (&local_11,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
             ,0xa1,"TrimFlags","IsValidFlagCombination(flags)");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return flags_00;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int TrimFlags(unsigned int flags)
{
    // WITNESS requires P2SH
    if (!(flags & SCRIPT_VERIFY_P2SH)) flags &= ~(unsigned int)SCRIPT_VERIFY_WITNESS;

    // CLEANSTACK requires WITNESS (and transitively CLEANSTACK requires P2SH)
    if (!(flags & SCRIPT_VERIFY_WITNESS)) flags &= ~(unsigned int)SCRIPT_VERIFY_CLEANSTACK;
    Assert(IsValidFlagCombination(flags));
    return flags;
}